

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O0

void __thiscall Wasm::WasmBinaryReader::PrintOps(WasmBinaryReader *this)

{
  bool bVar1;
  WasmOp WVar2;
  uint uVar3;
  Memory *this_00;
  WasmFunctionInfo *this_01;
  FunctionBody *this_02;
  uint32 moduleId;
  uint32 uStack_7c;
  WasmOp tmp;
  int j;
  int i;
  EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
  iter;
  TrackAllocData local_48;
  WasmOp *local_20;
  WasmOp *ops;
  WasmBinaryReader *pWStack_10;
  int count;
  WasmBinaryReader *this_local;
  
  pWStack_10 = this;
  ops._4_4_ = JsUtil::
              BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::Count(this->m_ops);
  if (ops._4_4_ != 0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&WasmOp::typeinfo,0,(long)ops._4_4_,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmBinaryReader.cpp"
               ,0xb8);
    this_00 = (Memory *)
              Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
    iter.
    super_IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = Memory::HeapAllocator::Alloc;
    local_20 = Memory::AllocateArray<Memory::HeapAllocator,Wasm::WasmOp,false>
                         (this_00,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,(long)ops._4_4_);
    JsUtil::
    BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::GetIterator((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   *)&j,this->m_ops);
    uStack_7c = 0;
    while (bVar1 = JsUtil::
                   BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   ::
                   EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                   ::IsValid((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                              *)&j), bVar1) {
      WVar2 = JsUtil::
              BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::
              IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
              ::CurrentKey((IteratorBase<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>_>
                            *)&j);
      local_20[(int)uStack_7c] = WVar2;
      JsUtil::
      BaseDictionary<Wasm::WasmOp,_Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseHashSet<Wasm::WasmOp,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Wasm::WasmOp,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>_>
                  *)&j);
      uStack_7c = uStack_7c + 1;
    }
    for (uStack_7c = 0; (int)uStack_7c < ops._4_4_; uStack_7c = uStack_7c + 1) {
      moduleId = uStack_7c;
      while( true ) {
        bVar1 = false;
        if (0 < (int)moduleId) {
          bVar1 = local_20[(int)moduleId] < local_20[(int)(moduleId - 1)];
        }
        if (!bVar1) break;
        WVar2 = local_20[(int)moduleId];
        local_20[(int)moduleId] = local_20[(int)(moduleId - 1)];
        local_20[(int)(moduleId - 1)] = WVar2;
        moduleId = moduleId - 1;
      }
    }
    this_01 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,0);
    this_02 = WasmFunctionInfo::GetBody(this_01);
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_02);
    Output::Print(L"Module #%u\'s current opcode distribution\n",(ulong)uVar3);
    for (uStack_7c = 0; (int)uStack_7c < ops._4_4_; uStack_7c = uStack_7c + 1) {
      WVar2 = local_20[(int)uStack_7c];
      if (WVar2 == wbUnreachable) {
        Output::Print(L"%s: %s\r\n",L"Unreachable",L"unreachable");
      }
      else if (WVar2 == wbNop) {
        Output::Print(L"%s: %s\r\n",L"Nop",L"nop");
      }
      else if (WVar2 == wbBlock) {
        Output::Print(L"%s: %s\r\n",L"Block",L"block");
      }
      else if (WVar2 == wbLoop) {
        Output::Print(L"%s: %s\r\n",L"Loop",L"loop");
      }
      else if (WVar2 == wbIf) {
        Output::Print(L"%s: %s\r\n",L"If",L"if");
      }
      else if (WVar2 == wbElse) {
        Output::Print(L"%s: %s\r\n",L"Else",L"else");
      }
      else if (WVar2 == wbEnd) {
        Output::Print(L"%s: %s\r\n",L"End",L"end");
      }
      else if (WVar2 == wbBr) {
        Output::Print(L"%s: %s\r\n",L"Br",L"br");
      }
      else if (WVar2 == wbBrIf) {
        Output::Print(L"%s: %s\r\n",L"BrIf",L"br_if");
      }
      else if (WVar2 == wbBrTable) {
        Output::Print(L"%s: %s\r\n",L"BrTable",L"br_table");
      }
      else if (WVar2 == wbReturn) {
        Output::Print(L"%s: %s\r\n",L"Return",L"return");
      }
      else if (WVar2 == wbCall) {
        Output::Print(L"%s: %s\r\n",L"Call",L"call");
      }
      else if (WVar2 == wbCallIndirect) {
        Output::Print(L"%s: %s\r\n",L"CallIndirect",L"call_indirect");
      }
      else if (WVar2 == wbDrop) {
        Output::Print(L"%s: %s\r\n",L"Drop",L"drop");
      }
      else if (WVar2 == wbSelect) {
        Output::Print(L"%s: %s\r\n",L"Select",L"select");
      }
      else if (WVar2 == wbGetLocal) {
        Output::Print(L"%s: %s\r\n",L"GetLocal",L"get_local");
      }
      else if (WVar2 == wbSetLocal) {
        Output::Print(L"%s: %s\r\n",L"SetLocal",L"set_local");
      }
      else if (WVar2 == wbTeeLocal) {
        Output::Print(L"%s: %s\r\n",L"TeeLocal",L"tee_local");
      }
      else if (WVar2 == wbGetGlobal) {
        Output::Print(L"%s: %s\r\n",L"GetGlobal",L"get_global");
      }
      else if (WVar2 == wbSetGlobal) {
        Output::Print(L"%s: %s\r\n",L"SetGlobal",L"set_global");
      }
      else if (WVar2 == wbI32LoadMem) {
        Output::Print(L"%s: %s\r\n",L"I32LoadMem",L"i32.load");
      }
      else if (WVar2 == wbI64LoadMem) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem",L"i64.load");
      }
      else if (WVar2 == wbF32LoadMem) {
        Output::Print(L"%s: %s\r\n",L"F32LoadMem",L"f32.load");
      }
      else if (WVar2 == wbF64LoadMem) {
        Output::Print(L"%s: %s\r\n",L"F64LoadMem",L"f64.load");
      }
      else if (WVar2 == wbI32LoadMem8S) {
        Output::Print(L"%s: %s\r\n",L"I32LoadMem8S",L"i32.load8_s");
      }
      else if (WVar2 == wbI32LoadMem8U) {
        Output::Print(L"%s: %s\r\n",L"I32LoadMem8U",L"i32.load8_u");
      }
      else if (WVar2 == wbI32LoadMem16S) {
        Output::Print(L"%s: %s\r\n",L"I32LoadMem16S",L"i32.load16_s");
      }
      else if (WVar2 == wbI32LoadMem16U) {
        Output::Print(L"%s: %s\r\n",L"I32LoadMem16U",L"i32.load16_u");
      }
      else if (WVar2 == wbI64LoadMem8S) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem8S",L"i64.load8_s");
      }
      else if (WVar2 == wbI64LoadMem8U) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem8U",L"i64.load8_u");
      }
      else if (WVar2 == wbI64LoadMem16S) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem16S",L"i64.load16_s");
      }
      else if (WVar2 == wbI64LoadMem16U) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem16U",L"i64.load16_u");
      }
      else if (WVar2 == wbI64LoadMem32S) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem32S",L"i64.load32_s");
      }
      else if (WVar2 == wbI64LoadMem32U) {
        Output::Print(L"%s: %s\r\n",L"I64LoadMem32U",L"i64.load32_u");
      }
      else if (WVar2 == wbI32StoreMem) {
        Output::Print(L"%s: %s\r\n",L"I32StoreMem",L"i32.store");
      }
      else if (WVar2 == wbI64StoreMem) {
        Output::Print(L"%s: %s\r\n",L"I64StoreMem",L"i64.store");
      }
      else if (WVar2 == wbF32StoreMem) {
        Output::Print(L"%s: %s\r\n",L"F32StoreMem",L"f32.store");
      }
      else if (WVar2 == wbF64StoreMem) {
        Output::Print(L"%s: %s\r\n",L"F64StoreMem",L"f64.store");
      }
      else if (WVar2 == wbI32StoreMem8) {
        Output::Print(L"%s: %s\r\n",L"I32StoreMem8",L"i32.store8");
      }
      else if (WVar2 == wbI32StoreMem16) {
        Output::Print(L"%s: %s\r\n",L"I32StoreMem16",L"i32.store16");
      }
      else if (WVar2 == wbI64StoreMem8) {
        Output::Print(L"%s: %s\r\n",L"I64StoreMem8",L"i64.store8");
      }
      else if (WVar2 == wbI64StoreMem16) {
        Output::Print(L"%s: %s\r\n",L"I64StoreMem16",L"i64.store16");
      }
      else if (WVar2 == wbI64StoreMem32) {
        Output::Print(L"%s: %s\r\n",L"I64StoreMem32",L"i64.store32");
      }
      else if (WVar2 == wbMemorySize) {
        Output::Print(L"%s: %s\r\n",L"MemorySize",L"memory.size");
      }
      else if (WVar2 == wbMemoryGrow) {
        Output::Print(L"%s: %s\r\n",L"MemoryGrow",L"memory.grow");
      }
      else if (WVar2 == wbI32Const) {
        Output::Print(L"%s: %s\r\n",L"I32Const",L"i32.const");
      }
      else if (WVar2 == wbI64Const) {
        Output::Print(L"%s: %s\r\n",L"I64Const",L"i64.const");
      }
      else if (WVar2 == wbF32Const) {
        Output::Print(L"%s: %s\r\n",L"F32Const",L"f32.const");
      }
      else if (WVar2 == wbF64Const) {
        Output::Print(L"%s: %s\r\n",L"F64Const",L"f64.const");
      }
      else if (WVar2 == wbI32Eqz) {
        Output::Print(L"%s: %s\r\n",L"I32Eqz",L"i32.eqz");
      }
      else if (WVar2 == wbI32Eq) {
        Output::Print(L"%s: %s\r\n",L"I32Eq",L"i32.eq");
      }
      else if (WVar2 == wbI32Ne) {
        Output::Print(L"%s: %s\r\n",L"I32Ne",L"i32.ne");
      }
      else if (WVar2 == wbI32LtS) {
        Output::Print(L"%s: %s\r\n",L"I32LtS",L"i32.lt_s");
      }
      else if (WVar2 == wbI32LtU) {
        Output::Print(L"%s: %s\r\n",L"I32LtU",L"i32.lt_u");
      }
      else if (WVar2 == wbI32GtS) {
        Output::Print(L"%s: %s\r\n",L"I32GtS",L"i32.gt_s");
      }
      else if (WVar2 == wbI32GtU) {
        Output::Print(L"%s: %s\r\n",L"I32GtU",L"i32.gt_u");
      }
      else if (WVar2 == wbI32LeS) {
        Output::Print(L"%s: %s\r\n",L"I32LeS",L"i32.le_s");
      }
      else if (WVar2 == wbI32LeU) {
        Output::Print(L"%s: %s\r\n",L"I32LeU",L"i32.le_u");
      }
      else if (WVar2 == wbI32GeS) {
        Output::Print(L"%s: %s\r\n",L"I32GeS",L"i32.ge_s");
      }
      else if (WVar2 == wbI32GeU) {
        Output::Print(L"%s: %s\r\n",L"I32GeU",L"i32.ge_u");
      }
      else if (WVar2 == wbI64Eqz) {
        Output::Print(L"%s: %s\r\n",L"I64Eqz",L"i64.eqz");
      }
      else if (WVar2 == wbI64Eq) {
        Output::Print(L"%s: %s\r\n",L"I64Eq",L"i64.eq");
      }
      else if (WVar2 == wbI64Ne) {
        Output::Print(L"%s: %s\r\n",L"I64Ne",L"i64.ne");
      }
      else if (WVar2 == wbI64LtS) {
        Output::Print(L"%s: %s\r\n",L"I64LtS",L"i64.lt_s");
      }
      else if (WVar2 == wbI64LtU) {
        Output::Print(L"%s: %s\r\n",L"I64LtU",L"i64.lt_u");
      }
      else if (WVar2 == wbI64GtS) {
        Output::Print(L"%s: %s\r\n",L"I64GtS",L"i64.gt_s");
      }
      else if (WVar2 == wbI64GtU) {
        Output::Print(L"%s: %s\r\n",L"I64GtU",L"i64.gt_u");
      }
      else if (WVar2 == wbI64LeS) {
        Output::Print(L"%s: %s\r\n",L"I64LeS",L"i64.le_s");
      }
      else if (WVar2 == wbI64LeU) {
        Output::Print(L"%s: %s\r\n",L"I64LeU",L"i64.le_u");
      }
      else if (WVar2 == wbI64GeS) {
        Output::Print(L"%s: %s\r\n",L"I64GeS",L"i64.ge_s");
      }
      else if (WVar2 == wbI64GeU) {
        Output::Print(L"%s: %s\r\n",L"I64GeU",L"i64.ge_u");
      }
      else if (WVar2 == wbF32Eq) {
        Output::Print(L"%s: %s\r\n",L"F32Eq",L"f32.eq");
      }
      else if (WVar2 == wbF32Ne) {
        Output::Print(L"%s: %s\r\n",L"F32Ne",L"f32.ne");
      }
      else if (WVar2 == wbF32Lt) {
        Output::Print(L"%s: %s\r\n",L"F32Lt",L"f32.lt");
      }
      else if (WVar2 == wbF32Gt) {
        Output::Print(L"%s: %s\r\n",L"F32Gt",L"f32.gt");
      }
      else if (WVar2 == wbF32Le) {
        Output::Print(L"%s: %s\r\n",L"F32Le",L"f32.le");
      }
      else if (WVar2 == wbF32Ge) {
        Output::Print(L"%s: %s\r\n",L"F32Ge",L"f32.ge");
      }
      else if (WVar2 == wbF64Eq) {
        Output::Print(L"%s: %s\r\n",L"F64Eq",L"f64.eq");
      }
      else if (WVar2 == wbF64Ne) {
        Output::Print(L"%s: %s\r\n",L"F64Ne",L"f64.ne");
      }
      else if (WVar2 == wbF64Lt) {
        Output::Print(L"%s: %s\r\n",L"F64Lt",L"f64.lt");
      }
      else if (WVar2 == wbF64Gt) {
        Output::Print(L"%s: %s\r\n",L"F64Gt",L"f64.gt");
      }
      else if (WVar2 == wbF64Le) {
        Output::Print(L"%s: %s\r\n",L"F64Le",L"f64.le");
      }
      else if (WVar2 == wbF64Ge) {
        Output::Print(L"%s: %s\r\n",L"F64Ge",L"f64.ge");
      }
      else if (WVar2 == wbI32Clz) {
        Output::Print(L"%s: %s\r\n",L"I32Clz",L"i32.clz");
      }
      else if (WVar2 == wbI32Ctz) {
        Output::Print(L"%s: %s\r\n",L"I32Ctz",L"i32.ctz");
      }
      else if (WVar2 == wbI32Popcnt) {
        Output::Print(L"%s: %s\r\n",L"I32Popcnt",L"i32.popcnt");
      }
      else if (WVar2 == wbI32Add) {
        Output::Print(L"%s: %s\r\n",L"I32Add",L"i32.add");
      }
      else if (WVar2 == wbI32Sub) {
        Output::Print(L"%s: %s\r\n",L"I32Sub",L"i32.sub");
      }
      else if (WVar2 == wbI32Mul) {
        Output::Print(L"%s: %s\r\n",L"I32Mul",L"i32.mul");
      }
      else if (WVar2 == wbI32DivS) {
        Output::Print(L"%s: %s\r\n",L"I32DivS",L"i32.div_s");
      }
      else if (WVar2 == wbI32DivU) {
        Output::Print(L"%s: %s\r\n",L"I32DivU",L"i32.div_u");
      }
      else if (WVar2 == wbI32RemS) {
        Output::Print(L"%s: %s\r\n",L"I32RemS",L"i32.rem_s");
      }
      else if (WVar2 == wbI32RemU) {
        Output::Print(L"%s: %s\r\n",L"I32RemU",L"i32.rem_u");
      }
      else if (WVar2 == wbI32And) {
        Output::Print(L"%s: %s\r\n",L"I32And",L"i32.and");
      }
      else if (WVar2 == wbI32Or) {
        Output::Print(L"%s: %s\r\n",L"I32Or",L"i32.or");
      }
      else if (WVar2 == wbI32Xor) {
        Output::Print(L"%s: %s\r\n",L"I32Xor",L"i32.xor");
      }
      else if (WVar2 == wbI32Shl) {
        Output::Print(L"%s: %s\r\n",L"I32Shl",L"i32.shl");
      }
      else if (WVar2 == wbI32ShrS) {
        Output::Print(L"%s: %s\r\n",L"I32ShrS",L"i32.shr_s");
      }
      else if (WVar2 == wbI32ShrU) {
        Output::Print(L"%s: %s\r\n",L"I32ShrU",L"i32.shr_u");
      }
      else if (WVar2 == wbI32Rol) {
        Output::Print(L"%s: %s\r\n",L"I32Rol",L"i32.rotl");
      }
      else if (WVar2 == wbI32Ror) {
        Output::Print(L"%s: %s\r\n",L"I32Ror",L"i32.rotr");
      }
      else if (WVar2 == wbI64Clz) {
        Output::Print(L"%s: %s\r\n",L"I64Clz",L"i64.clz");
      }
      else if (WVar2 == wbI64Ctz) {
        Output::Print(L"%s: %s\r\n",L"I64Ctz",L"i64.ctz");
      }
      else if (WVar2 == wbI64Popcnt) {
        Output::Print(L"%s: %s\r\n",L"I64Popcnt",L"i64.popcnt");
      }
      else if (WVar2 == wbI64Add) {
        Output::Print(L"%s: %s\r\n",L"I64Add",L"i64.add");
      }
      else if (WVar2 == wbI64Sub) {
        Output::Print(L"%s: %s\r\n",L"I64Sub",L"i64.sub");
      }
      else if (WVar2 == wbI64Mul) {
        Output::Print(L"%s: %s\r\n",L"I64Mul",L"i64.mul");
      }
      else if (WVar2 == wbI64DivS) {
        Output::Print(L"%s: %s\r\n",L"I64DivS",L"i64.div_s");
      }
      else if (WVar2 == wbI64DivU) {
        Output::Print(L"%s: %s\r\n",L"I64DivU",L"i64.div_u");
      }
      else if (WVar2 == wbI64RemS) {
        Output::Print(L"%s: %s\r\n",L"I64RemS",L"i64.rem_s");
      }
      else if (WVar2 == wbI64RemU) {
        Output::Print(L"%s: %s\r\n",L"I64RemU",L"i64.rem_u");
      }
      else if (WVar2 == wbI64And) {
        Output::Print(L"%s: %s\r\n",L"I64And",L"i64.and");
      }
      else if (WVar2 == wbI64Or) {
        Output::Print(L"%s: %s\r\n",L"I64Or",L"i64.or");
      }
      else if (WVar2 == wbI64Xor) {
        Output::Print(L"%s: %s\r\n",L"I64Xor",L"i64.xor");
      }
      else if (WVar2 == wbI64Shl) {
        Output::Print(L"%s: %s\r\n",L"I64Shl",L"i64.shl");
      }
      else if (WVar2 == wbI64ShrS) {
        Output::Print(L"%s: %s\r\n",L"I64ShrS",L"i64.shr_s");
      }
      else if (WVar2 == wbI64ShrU) {
        Output::Print(L"%s: %s\r\n",L"I64ShrU",L"i64.shr_u");
      }
      else if (WVar2 == wbI64Rol) {
        Output::Print(L"%s: %s\r\n",L"I64Rol",L"i64.rotl");
      }
      else if (WVar2 == wbI64Ror) {
        Output::Print(L"%s: %s\r\n",L"I64Ror",L"i64.rotr");
      }
      else if (WVar2 == wbF32Abs) {
        Output::Print(L"%s: %s\r\n",L"F32Abs",L"f32.abs");
      }
      else if (WVar2 == wbF32Neg) {
        Output::Print(L"%s: %s\r\n",L"F32Neg",L"f32.neg");
      }
      else if (WVar2 == wbF32Ceil) {
        Output::Print(L"%s: %s\r\n",L"F32Ceil",L"f32.ceil");
      }
      else if (WVar2 == wbF32Floor) {
        Output::Print(L"%s: %s\r\n",L"F32Floor",L"f32.floor");
      }
      else if (WVar2 == wbF32Trunc) {
        Output::Print(L"%s: %s\r\n",L"F32Trunc",L"f32.trunc");
      }
      else if (WVar2 == wbF32NearestInt) {
        Output::Print(L"%s: %s\r\n",L"F32NearestInt",L"f32.nearest");
      }
      else if (WVar2 == wbF32Sqrt) {
        Output::Print(L"%s: %s\r\n",L"F32Sqrt",L"f32.sqrt");
      }
      else if (WVar2 == wbF32Add) {
        Output::Print(L"%s: %s\r\n",L"F32Add",L"f32.add");
      }
      else if (WVar2 == wbF32Sub) {
        Output::Print(L"%s: %s\r\n",L"F32Sub",L"f32.sub");
      }
      else if (WVar2 == wbF32Mul) {
        Output::Print(L"%s: %s\r\n",L"F32Mul",L"f32.mul");
      }
      else if (WVar2 == wbF32Div) {
        Output::Print(L"%s: %s\r\n",L"F32Div",L"f32.div");
      }
      else if (WVar2 == wbF32Min) {
        Output::Print(L"%s: %s\r\n",L"F32Min",L"f32.min");
      }
      else if (WVar2 == wbF32Max) {
        Output::Print(L"%s: %s\r\n",L"F32Max",L"f32.max");
      }
      else if (WVar2 == wbF32CopySign) {
        Output::Print(L"%s: %s\r\n",L"F32CopySign",L"f32.copysign");
      }
      else if (WVar2 == wbF64Abs) {
        Output::Print(L"%s: %s\r\n",L"F64Abs",L"f64.abs");
      }
      else if (WVar2 == wbF64Neg) {
        Output::Print(L"%s: %s\r\n",L"F64Neg",L"f64.neg");
      }
      else if (WVar2 == wbF64Ceil) {
        Output::Print(L"%s: %s\r\n",L"F64Ceil",L"f64.ceil");
      }
      else if (WVar2 == wbF64Floor) {
        Output::Print(L"%s: %s\r\n",L"F64Floor",L"f64.floor");
      }
      else if (WVar2 == wbF64Trunc) {
        Output::Print(L"%s: %s\r\n",L"F64Trunc",L"f64.trunc");
      }
      else if (WVar2 == wbF64NearestInt) {
        Output::Print(L"%s: %s\r\n",L"F64NearestInt",L"f64.nearest");
      }
      else if (WVar2 == wbF64Sqrt) {
        Output::Print(L"%s: %s\r\n",L"F64Sqrt",L"f64.sqrt");
      }
      else if (WVar2 == wbF64Add) {
        Output::Print(L"%s: %s\r\n",L"F64Add",L"f64.add");
      }
      else if (WVar2 == wbF64Sub) {
        Output::Print(L"%s: %s\r\n",L"F64Sub",L"f64.sub");
      }
      else if (WVar2 == wbF64Mul) {
        Output::Print(L"%s: %s\r\n",L"F64Mul",L"f64.mul");
      }
      else if (WVar2 == wbF64Div) {
        Output::Print(L"%s: %s\r\n",L"F64Div",L"f64.div");
      }
      else if (WVar2 == wbF64Min) {
        Output::Print(L"%s: %s\r\n",L"F64Min",L"f64.min");
      }
      else if (WVar2 == wbF64Max) {
        Output::Print(L"%s: %s\r\n",L"F64Max",L"f64.max");
      }
      else if (WVar2 == wbF64CopySign) {
        Output::Print(L"%s: %s\r\n",L"F64CopySign",L"f64.copysign");
      }
      else if (WVar2 == wbI32Wrap_I64) {
        Output::Print(L"%s: %s\r\n",L"I32Wrap_I64",L"i32.wrap/i64");
      }
      else if (WVar2 == wbI32TruncS_F32) {
        Output::Print(L"%s: %s\r\n",L"I32TruncS_F32",L"i32.trunc_s/f32");
      }
      else if (WVar2 == wbI32TruncU_F32) {
        Output::Print(L"%s: %s\r\n",L"I32TruncU_F32",L"i32.trunc_u/f32");
      }
      else if (WVar2 == wbI32TruncS_F64) {
        Output::Print(L"%s: %s\r\n",L"I32TruncS_F64",L"i32.trunc_s/f64");
      }
      else if (WVar2 == wbI32TruncU_F64) {
        Output::Print(L"%s: %s\r\n",L"I32TruncU_F64",L"i32.trunc_u/f64");
      }
      else if (WVar2 == wbI64ExtendS_I32) {
        Output::Print(L"%s: %s\r\n",L"I64ExtendS_I32",L"i64.extend_s/i32");
      }
      else if (WVar2 == wbI64ExtendU_I32) {
        Output::Print(L"%s: %s\r\n",L"I64ExtendU_I32",L"i64.extend_u/i32");
      }
      else if (WVar2 == wbI64TruncS_F32) {
        Output::Print(L"%s: %s\r\n",L"I64TruncS_F32",L"i64.trunc_s/f32");
      }
      else if (WVar2 == wbI64TruncU_F32) {
        Output::Print(L"%s: %s\r\n",L"I64TruncU_F32",L"i64.trunc_u/f32");
      }
      else if (WVar2 == wbI64TruncS_F64) {
        Output::Print(L"%s: %s\r\n",L"I64TruncS_F64",L"i64.trunc_s/f64");
      }
      else if (WVar2 == wbI64TruncU_F64) {
        Output::Print(L"%s: %s\r\n",L"I64TruncU_F64",L"i64.trunc_u/f64");
      }
      else if (WVar2 == wbF32SConvertI32) {
        Output::Print(L"%s: %s\r\n",L"F32SConvertI32",L"f32.convert_s/i32");
      }
      else if (WVar2 == wbF32UConvertI32) {
        Output::Print(L"%s: %s\r\n",L"F32UConvertI32",L"f32.convert_u/i32");
      }
      else if (WVar2 == wbF32SConvertI64) {
        Output::Print(L"%s: %s\r\n",L"F32SConvertI64",L"f32.convert_s/i64");
      }
      else if (WVar2 == wbF32UConvertI64) {
        Output::Print(L"%s: %s\r\n",L"F32UConvertI64",L"f32.convert_u/i64");
      }
      else if (WVar2 == wbF32DemoteF64) {
        Output::Print(L"%s: %s\r\n",L"F32DemoteF64",L"f32.demote/f64");
      }
      else if (WVar2 == wbF64SConvertI32) {
        Output::Print(L"%s: %s\r\n",L"F64SConvertI32",L"f64.convert_s/i32");
      }
      else if (WVar2 == wbF64UConvertI32) {
        Output::Print(L"%s: %s\r\n",L"F64UConvertI32",L"f64.convert_u/i32");
      }
      else if (WVar2 == wbF64SConvertI64) {
        Output::Print(L"%s: %s\r\n",L"F64SConvertI64",L"f64.convert_s/i64");
      }
      else if (WVar2 == wbF64UConvertI64) {
        Output::Print(L"%s: %s\r\n",L"F64UConvertI64",L"f64.convert_u/i64");
      }
      else if (WVar2 == wbF64PromoteF32) {
        Output::Print(L"%s: %s\r\n",L"F64PromoteF32",L"f64.promote/f32");
      }
      else if (WVar2 == wbI32ReinterpretF32) {
        Output::Print(L"%s: %s\r\n",L"I32ReinterpretF32",L"i32.reinterpret/f32");
      }
      else if (WVar2 == wbI64ReinterpretF64) {
        Output::Print(L"%s: %s\r\n",L"I64ReinterpretF64",L"i64.reinterpret/f64");
      }
      else if (WVar2 == wbF32ReinterpretI32) {
        Output::Print(L"%s: %s\r\n",L"F32ReinterpretI32",L"f32.reinterpret/i32");
      }
      else if (WVar2 == wbF64ReinterpretI64) {
        Output::Print(L"%s: %s\r\n",L"F64ReinterpretI64",L"f64.reinterpret/i64");
      }
      else if (WVar2 == wbI32Extend8_s) {
        Output::Print(L"%s: %s\r\n",L"I32Extend8_s",L"i32.extend8_s");
      }
      else if (WVar2 == wbI32Extend16_s) {
        Output::Print(L"%s: %s\r\n",L"I32Extend16_s",L"i32.extend16_s");
      }
      else if (WVar2 == wbI64Extend8_s) {
        Output::Print(L"%s: %s\r\n",L"I64Extend8_s",L"i64.extend8_s");
      }
      else if (WVar2 == wbI64Extend16_s) {
        Output::Print(L"%s: %s\r\n",L"I64Extend16_s",L"i64.extend16_s");
      }
      else if (WVar2 == wbI64Extend32_s) {
        Output::Print(L"%s: %s\r\n",L"I64Extend32_s",L"i64.extend32_s");
      }
      else if (WVar2 == wbPrintFuncName) {
        Output::Print(L"%s: %s\r\n",L"PrintFuncName",L"");
      }
      else if (WVar2 == wbPrintArgSeparator) {
        Output::Print(L"%s: %s\r\n",L"PrintArgSeparator",L"");
      }
      else if (WVar2 == wbPrintBeginCall) {
        Output::Print(L"%s: %s\r\n",L"PrintBeginCall",L"");
      }
      else if (WVar2 == wbPrintNewLine) {
        Output::Print(L"%s: %s\r\n",L"PrintNewLine",L"");
      }
      else if (WVar2 == wbPrintEndCall) {
        Output::Print(L"%s: %s\r\n",L"PrintEndCall",L"");
      }
      else if (WVar2 == wbPrintI32) {
        Output::Print(L"%s: %s\r\n",L"PrintI32",L"");
      }
      else if (WVar2 == wbPrintI64) {
        Output::Print(L"%s: %s\r\n",L"PrintI64",L"");
      }
      else if (WVar2 == wbPrintF32) {
        Output::Print(L"%s: %s\r\n",L"PrintF32",L"");
      }
      else if (WVar2 == wbPrintF64) {
        Output::Print(L"%s: %s\r\n",L"PrintF64",L"");
      }
      else if (WVar2 == wbI32SatTruncS_F32) {
        Output::Print(L"%s: %s\r\n",L"I32SatTruncS_F32",L"i32.trunc_s:sat/f32");
      }
      else if (WVar2 == wbI32SatTruncU_F32) {
        Output::Print(L"%s: %s\r\n",L"I32SatTruncU_F32",L"i32.trunc_u:sat/f32");
      }
      else if (WVar2 == wbI32SatTruncS_F64) {
        Output::Print(L"%s: %s\r\n",L"I32SatTruncS_F64",L"i32.trunc_s:sat/f64");
      }
      else if (WVar2 == wbI32SatTruncU_F64) {
        Output::Print(L"%s: %s\r\n",L"I32SatTruncU_F64",L"i32.trunc_u:sat/f64");
      }
      else if (WVar2 == wbI64SatTruncS_F32) {
        Output::Print(L"%s: %s\r\n",L"I64SatTruncS_F32",L"i64.trunc_s:sat/f32");
      }
      else if (WVar2 == wbI64SatTruncU_F32) {
        Output::Print(L"%s: %s\r\n",L"I64SatTruncU_F32",L"i64.trunc_u:sat/f32");
      }
      else if (WVar2 == wbI64SatTruncS_F64) {
        Output::Print(L"%s: %s\r\n",L"I64SatTruncS_F64",L"i64.trunc_s:sat/f64");
      }
      else if (WVar2 == wbI64SatTruncU_F64) {
        Output::Print(L"%s: %s\r\n",L"I64SatTruncU_F64",L"i64.trunc_u:sat/f64");
      }
      else if (WVar2 == wbV128Load) {
        Output::Print(L"%s: %s\r\n",L"V128Load",L"v128.load");
      }
      else if (WVar2 == wbV128Store) {
        Output::Print(L"%s: %s\r\n",L"V128Store",L"v128.store");
      }
      else if (WVar2 == wbV128Const) {
        Output::Print(L"%s: %s\r\n",L"V128Const",L"v128.const");
      }
      else if (WVar2 == wbV8X16Shuffle) {
        Output::Print(L"%s: %s\r\n",L"V8X16Shuffle",L"i8x16.shuffle");
      }
      else if (WVar2 == wbI16Splat) {
        Output::Print(L"%s: %s\r\n",L"I16Splat",L"i8x16.splat");
      }
      else if (WVar2 == wbI8Splat) {
        Output::Print(L"%s: %s\r\n",L"I8Splat",L"i16x8.splat");
      }
      else if (WVar2 == wbI4Splat) {
        Output::Print(L"%s: %s\r\n",L"I4Splat",L"i32x4.splat");
      }
      else if (WVar2 == wbI2Splat) {
        Output::Print(L"%s: %s\r\n",L"I2Splat",L"i64x2.splat");
      }
      else if (WVar2 == wbF4Splat) {
        Output::Print(L"%s: %s\r\n",L"F4Splat",L"f32x4.splat");
      }
      else if (WVar2 == wbF2Splat) {
        Output::Print(L"%s: %s\r\n",L"F2Splat",L"f64x2.splat");
      }
      else if (WVar2 == wbI16ExtractLaneS) {
        Output::Print(L"%s: %s\r\n",L"I16ExtractLaneS",L"i8x16.extract_lane_s");
      }
      else if (WVar2 == wbI16ExtractLaneU) {
        Output::Print(L"%s: %s\r\n",L"I16ExtractLaneU",L"i8x16.extract_lane_u");
      }
      else if (WVar2 == wbI16ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"I16ReplaceLane",L"i8x16.replace_lane");
      }
      else if (WVar2 == wbI8ExtractLaneS) {
        Output::Print(L"%s: %s\r\n",L"I8ExtractLaneS",L"i16x8.extract_lane_s");
      }
      else if (WVar2 == wbI8ExtractLaneU) {
        Output::Print(L"%s: %s\r\n",L"I8ExtractLaneU",L"i16x8.extract_lane_u");
      }
      else if (WVar2 == wbI8ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"I8ReplaceLane",L"i16x8.replace_lane");
      }
      else if (WVar2 == wbI4ExtractLane) {
        Output::Print(L"%s: %s\r\n",L"I4ExtractLane",L"i32x4.extract_lane");
      }
      else if (WVar2 == wbI4ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"I4ReplaceLane",L"i32x4.replace_lane");
      }
      else if (WVar2 == wbI2ExtractLane) {
        Output::Print(L"%s: %s\r\n",L"I2ExtractLane",L"i64x2.extract_lane");
      }
      else if (WVar2 == wbI2ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"I2ReplaceLane",L"i64x2.replace_lane");
      }
      else if (WVar2 == wbF4ExtractLane) {
        Output::Print(L"%s: %s\r\n",L"F4ExtractLane",L"f32x4.extract_lane");
      }
      else if (WVar2 == wbF4ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"F4ReplaceLane",L"f32x4.replace_lane");
      }
      else if (WVar2 == wbF2ExtractLane) {
        Output::Print(L"%s: %s\r\n",L"F2ExtractLane",L"f64x2.extract_lane");
      }
      else if (WVar2 == wbF2ReplaceLane) {
        Output::Print(L"%s: %s\r\n",L"F2ReplaceLane",L"f64x2.replace_lane");
      }
      else if (WVar2 == wbI16Eq) {
        Output::Print(L"%s: %s\r\n",L"I16Eq",L"i8x16.eq");
      }
      else if (WVar2 == wbI16Ne) {
        Output::Print(L"%s: %s\r\n",L"I16Ne",L"i8x16.ne");
      }
      else if (WVar2 == wbI16LtS) {
        Output::Print(L"%s: %s\r\n",L"I16LtS",L"i8x16.lt_s");
      }
      else if (WVar2 == wbI16LtU) {
        Output::Print(L"%s: %s\r\n",L"I16LtU",L"i8x16.lt_u");
      }
      else if (WVar2 == wbI16GtS) {
        Output::Print(L"%s: %s\r\n",L"I16GtS",L"i8x16.gt_s");
      }
      else if (WVar2 == wbI16GtU) {
        Output::Print(L"%s: %s\r\n",L"I16GtU",L"i8x16.gt_u");
      }
      else if (WVar2 == wbI16LeS) {
        Output::Print(L"%s: %s\r\n",L"I16LeS",L"i8x16.le_s");
      }
      else if (WVar2 == wbI16LeU) {
        Output::Print(L"%s: %s\r\n",L"I16LeU",L"i8x16.le_u");
      }
      else if (WVar2 == wbI16GeS) {
        Output::Print(L"%s: %s\r\n",L"I16GeS",L"i8x16.ge_s");
      }
      else if (WVar2 == wbI16GeU) {
        Output::Print(L"%s: %s\r\n",L"I16GeU",L"i8x16.ge_u");
      }
      else if (WVar2 == wbI8Eq) {
        Output::Print(L"%s: %s\r\n",L"I8Eq",L"i16x8.eq");
      }
      else if (WVar2 == wbI8Ne) {
        Output::Print(L"%s: %s\r\n",L"I8Ne",L"i16x8.ne");
      }
      else if (WVar2 == wbI8LtS) {
        Output::Print(L"%s: %s\r\n",L"I8LtS",L"i16x8.lt_s");
      }
      else if (WVar2 == wbI8LtU) {
        Output::Print(L"%s: %s\r\n",L"I8LtU",L"i16x8.lt_u");
      }
      else if (WVar2 == wbI8GtS) {
        Output::Print(L"%s: %s\r\n",L"I8GtS",L"i16x8.gt_s");
      }
      else if (WVar2 == wbI8GtU) {
        Output::Print(L"%s: %s\r\n",L"I8GtU",L"i16x8.gt_u");
      }
      else if (WVar2 == wbI8LeS) {
        Output::Print(L"%s: %s\r\n",L"I8LeS",L"i16x8.le_s");
      }
      else if (WVar2 == wbI8LeU) {
        Output::Print(L"%s: %s\r\n",L"I8LeU",L"i16x8.le_u");
      }
      else if (WVar2 == wbI8GeS) {
        Output::Print(L"%s: %s\r\n",L"I8GeS",L"i16x8.ge_s");
      }
      else if (WVar2 == wbI8GeU) {
        Output::Print(L"%s: %s\r\n",L"I8GeU",L"i16x8.ge_u");
      }
      else if (WVar2 == wbI4Eq) {
        Output::Print(L"%s: %s\r\n",L"I4Eq",L"i32x4.eq");
      }
      else if (WVar2 == wbI4Ne) {
        Output::Print(L"%s: %s\r\n",L"I4Ne",L"i32x4.ne");
      }
      else if (WVar2 == wbI4LtS) {
        Output::Print(L"%s: %s\r\n",L"I4LtS",L"i32x4.lt_s");
      }
      else if (WVar2 == wbI4LtU) {
        Output::Print(L"%s: %s\r\n",L"I4LtU",L"i32x4.lt_u");
      }
      else if (WVar2 == wbI4GtS) {
        Output::Print(L"%s: %s\r\n",L"I4GtS",L"i32x4.gt_s");
      }
      else if (WVar2 == wbI4GtU) {
        Output::Print(L"%s: %s\r\n",L"I4GtU",L"i32x4.gt_u");
      }
      else if (WVar2 == wbI4LeS) {
        Output::Print(L"%s: %s\r\n",L"I4LeS",L"i32x4.le_s");
      }
      else if (WVar2 == wbI4LeU) {
        Output::Print(L"%s: %s\r\n",L"I4LeU",L"i32x4.le_u");
      }
      else if (WVar2 == wbI4GeS) {
        Output::Print(L"%s: %s\r\n",L"I4GeS",L"i32x4.ge_s");
      }
      else if (WVar2 == wbI4GeU) {
        Output::Print(L"%s: %s\r\n",L"I4GeU",L"i32x4.ge_u");
      }
      else if (WVar2 == wbF4Eq) {
        Output::Print(L"%s: %s\r\n",L"F4Eq",L"f32x4.eq");
      }
      else if (WVar2 == wbF4Ne) {
        Output::Print(L"%s: %s\r\n",L"F4Ne",L"f32x4.ne");
      }
      else if (WVar2 == wbF4Lt) {
        Output::Print(L"%s: %s\r\n",L"F4Lt",L"f32x4.lt");
      }
      else if (WVar2 == wbF4Gt) {
        Output::Print(L"%s: %s\r\n",L"F4Gt",L"f32x4.gt");
      }
      else if (WVar2 == wbF4Le) {
        Output::Print(L"%s: %s\r\n",L"F4Le",L"f32x4.le");
      }
      else if (WVar2 == wbF4Ge) {
        Output::Print(L"%s: %s\r\n",L"F4Ge",L"f32x4.ge");
      }
      else if (WVar2 == wbF2Eq) {
        Output::Print(L"%s: %s\r\n",L"F2Eq",L"f64x2.eq");
      }
      else if (WVar2 == wbF2Ne) {
        Output::Print(L"%s: %s\r\n",L"F2Ne",L"f64x2.ne");
      }
      else if (WVar2 == wbF2Lt) {
        Output::Print(L"%s: %s\r\n",L"F2Lt",L"f64x2.lt");
      }
      else if (WVar2 == wbF2Gt) {
        Output::Print(L"%s: %s\r\n",L"F2Gt",L"f64x2.gt");
      }
      else if (WVar2 == wbF2Le) {
        Output::Print(L"%s: %s\r\n",L"F2Le",L"f64x2.le");
      }
      else if (WVar2 == wbF2Ge) {
        Output::Print(L"%s: %s\r\n",L"F2Ge",L"f64x2.ge");
      }
      else if (WVar2 == wbV128Not) {
        Output::Print(L"%s: %s\r\n",L"V128Not",L"v128.not");
      }
      else if (WVar2 == wbV128And) {
        Output::Print(L"%s: %s\r\n",L"V128And",L"v128.and");
      }
      else if (WVar2 == wbV128Or) {
        Output::Print(L"%s: %s\r\n",L"V128Or",L"v128.or");
      }
      else if (WVar2 == wbV128Xor) {
        Output::Print(L"%s: %s\r\n",L"V128Xor",L"v128.xor");
      }
      else if (WVar2 == wbV128Bitselect) {
        Output::Print(L"%s: %s\r\n",L"V128Bitselect",L"v128.bitselect");
      }
      else if (WVar2 == wbI16Neg) {
        Output::Print(L"%s: %s\r\n",L"I16Neg",L"i8x16.neg");
      }
      else if (WVar2 == wbI16AnyTrue) {
        Output::Print(L"%s: %s\r\n",L"I16AnyTrue",L"i8x16.any_true");
      }
      else if (WVar2 == wbI16AllTrue) {
        Output::Print(L"%s: %s\r\n",L"I16AllTrue",L"i8x16.all_true");
      }
      else if (WVar2 == wbI16Shl) {
        Output::Print(L"%s: %s\r\n",L"I16Shl",L"i8x16.shl");
      }
      else if (WVar2 == wbI16ShrS) {
        Output::Print(L"%s: %s\r\n",L"I16ShrS",L"i8x16.shr_s");
      }
      else if (WVar2 == wbI16ShrU) {
        Output::Print(L"%s: %s\r\n",L"I16ShrU",L"i8x16.shr_u");
      }
      else if (WVar2 == wbI16Add) {
        Output::Print(L"%s: %s\r\n",L"I16Add",L"i8x16.add");
      }
      else if (WVar2 == wbI16AddSaturateS) {
        Output::Print(L"%s: %s\r\n",L"I16AddSaturateS",L"i8x16.add_sat_s");
      }
      else if (WVar2 == wbI16AddSaturateU) {
        Output::Print(L"%s: %s\r\n",L"I16AddSaturateU",L"i8x16.add_sat_u");
      }
      else if (WVar2 == wbI16Sub) {
        Output::Print(L"%s: %s\r\n",L"I16Sub",L"i8x16.sub");
      }
      else if (WVar2 == wbI16SubSaturateS) {
        Output::Print(L"%s: %s\r\n",L"I16SubSaturateS",L"i8x16.sub_sat_s");
      }
      else if (WVar2 == wbI16SubSaturateU) {
        Output::Print(L"%s: %s\r\n",L"I16SubSaturateU",L"i8x16.sub_sat_u");
      }
      else if (WVar2 == wbI8Neg) {
        Output::Print(L"%s: %s\r\n",L"I8Neg",L"i16x8.neg");
      }
      else if (WVar2 == wbI8AnyTrue) {
        Output::Print(L"%s: %s\r\n",L"I8AnyTrue",L"i16x8.any_true");
      }
      else if (WVar2 == wbI8AllTrue) {
        Output::Print(L"%s: %s\r\n",L"I8AllTrue",L"i16x8.all_true");
      }
      else if (WVar2 == wbI8Shl) {
        Output::Print(L"%s: %s\r\n",L"I8Shl",L"i16x8.shl");
      }
      else if (WVar2 == wbI8ShrS) {
        Output::Print(L"%s: %s\r\n",L"I8ShrS",L"i16x8.shr_s");
      }
      else if (WVar2 == wbI8ShrU) {
        Output::Print(L"%s: %s\r\n",L"I8ShrU",L"i16x8.shr_u");
      }
      else if (WVar2 == wbI8Add) {
        Output::Print(L"%s: %s\r\n",L"I8Add",L"i16x8.add");
      }
      else if (WVar2 == wbI8AddSaturateS) {
        Output::Print(L"%s: %s\r\n",L"I8AddSaturateS",L"i16x8.add_sat_s");
      }
      else if (WVar2 == wbI8AddSaturateU) {
        Output::Print(L"%s: %s\r\n",L"I8AddSaturateU",L"i16x8.add_sat_u");
      }
      else if (WVar2 == wbI8Sub) {
        Output::Print(L"%s: %s\r\n",L"I8Sub",L"i16x8.sub");
      }
      else if (WVar2 == wbI8SubSaturateS) {
        Output::Print(L"%s: %s\r\n",L"I8SubSaturateS",L"i16x8.sub_sat_s");
      }
      else if (WVar2 == wbI8SubSaturateU) {
        Output::Print(L"%s: %s\r\n",L"I8SubSaturateU",L"i16x8.sub_sat_u");
      }
      else if (WVar2 == wbI8Mul) {
        Output::Print(L"%s: %s\r\n",L"I8Mul",L"i16x8.mul");
      }
      else if (WVar2 == wbI4Neg) {
        Output::Print(L"%s: %s\r\n",L"I4Neg",L"i32x4.neg");
      }
      else if (WVar2 == wbI4AnyTrue) {
        Output::Print(L"%s: %s\r\n",L"I4AnyTrue",L"i32x4.any_true");
      }
      else if (WVar2 == wbI4AllTrue) {
        Output::Print(L"%s: %s\r\n",L"I4AllTrue",L"i32x4.all_true");
      }
      else if (WVar2 == wbI4Shl) {
        Output::Print(L"%s: %s\r\n",L"I4Shl",L"i32x4.shl");
      }
      else if (WVar2 == wbI4ShrS) {
        Output::Print(L"%s: %s\r\n",L"I4ShrS",L"i32x4.shr_s");
      }
      else if (WVar2 == wbI4ShrU) {
        Output::Print(L"%s: %s\r\n",L"I4ShrU",L"i32x4.shr_u");
      }
      else if (WVar2 == wbI4Add) {
        Output::Print(L"%s: %s\r\n",L"I4Add",L"i32x4.add");
      }
      else if (WVar2 == wbI4Sub) {
        Output::Print(L"%s: %s\r\n",L"I4Sub",L"i32x4.sub");
      }
      else if (WVar2 == wbI4Mul) {
        Output::Print(L"%s: %s\r\n",L"I4Mul",L"i32x4.mul");
      }
      else if (WVar2 == wbI2Neg) {
        Output::Print(L"%s: %s\r\n",L"I2Neg",L"i64x2.neg");
      }
      else if (WVar2 == wbI2Shl) {
        Output::Print(L"%s: %s\r\n",L"I2Shl",L"i64x2.shl");
      }
      else if (WVar2 == wbI2ShrS) {
        Output::Print(L"%s: %s\r\n",L"I2ShrS",L"i64x2.shr_s");
      }
      else if (WVar2 == wbI2ShrU) {
        Output::Print(L"%s: %s\r\n",L"I2ShrU",L"i64x2.shr_u");
      }
      else if (WVar2 == wbI2Add) {
        Output::Print(L"%s: %s\r\n",L"I2Add",L"i64x2.add");
      }
      else if (WVar2 == wbI2Sub) {
        Output::Print(L"%s: %s\r\n",L"I2Sub",L"i64x2.sub");
      }
      else if (WVar2 == wbF4Abs) {
        Output::Print(L"%s: %s\r\n",L"F4Abs",L"f32x4.abs");
      }
      else if (WVar2 == wbF4Neg) {
        Output::Print(L"%s: %s\r\n",L"F4Neg",L"f32x4.neg");
      }
      else if (WVar2 == wbF4Sqrt) {
        Output::Print(L"%s: %s\r\n",L"F4Sqrt",L"f32x4.sqrt");
      }
      else if (WVar2 == wbF4Add) {
        Output::Print(L"%s: %s\r\n",L"F4Add",L"f32x4.add");
      }
      else if (WVar2 == wbF4Sub) {
        Output::Print(L"%s: %s\r\n",L"F4Sub",L"f32x4.sub");
      }
      else if (WVar2 == wbF4Mul) {
        Output::Print(L"%s: %s\r\n",L"F4Mul",L"f32x4.mul");
      }
      else if (WVar2 == wbF4Div) {
        Output::Print(L"%s: %s\r\n",L"F4Div",L"f32x4.div");
      }
      else if (WVar2 == wbF4Min) {
        Output::Print(L"%s: %s\r\n",L"F4Min",L"f32x4.min");
      }
      else if (WVar2 == wbF4Max) {
        Output::Print(L"%s: %s\r\n",L"F4Max",L"f32x4.max");
      }
      else if (WVar2 == wbF2Abs) {
        Output::Print(L"%s: %s\r\n",L"F2Abs",L"f64x2.abs");
      }
      else if (WVar2 == wbF2Neg) {
        Output::Print(L"%s: %s\r\n",L"F2Neg",L"f64x2.neg");
      }
      else if (WVar2 == wbF2Sqrt) {
        Output::Print(L"%s: %s\r\n",L"F2Sqrt",L"f64x2.sqrt");
      }
      else if (WVar2 == wbF2Add) {
        Output::Print(L"%s: %s\r\n",L"F2Add",L"f64x2.add");
      }
      else if (WVar2 == wbF2Sub) {
        Output::Print(L"%s: %s\r\n",L"F2Sub",L"f64x2.sub");
      }
      else if (WVar2 == wbF2Mul) {
        Output::Print(L"%s: %s\r\n",L"F2Mul",L"f64x2.mul");
      }
      else if (WVar2 == wbF2Div) {
        Output::Print(L"%s: %s\r\n",L"F2Div",L"f64x2.div");
      }
      else if (WVar2 == wbF2Min) {
        Output::Print(L"%s: %s\r\n",L"F2Min",L"f64x2.min");
      }
      else if (WVar2 == wbF2Max) {
        Output::Print(L"%s: %s\r\n",L"F2Max",L"f64x2.max");
      }
      else if (WVar2 == wbI4TruncS) {
        Output::Print(L"%s: %s\r\n",L"I4TruncS",L"i32x4.trunc_sat_f32x4_s");
      }
      else if (WVar2 == wbI4TruncU) {
        Output::Print(L"%s: %s\r\n",L"I4TruncU",L"i32x4.trunc_sat_f32x4_u");
      }
      else if (WVar2 == wbF4ConvertS) {
        Output::Print(L"%s: %s\r\n",L"F4ConvertS",L"f32x4.convert_i32x4_s");
      }
      else if (WVar2 == wbF4ConvertU) {
        Output::Print(L"%s: %s\r\n",L"F4ConvertU",L"f32x4.convert_i32x4_u");
      }
      else if (WVar2 == wbI32AtomicLoad) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicLoad",L"i32.atomic.load");
      }
      else if (WVar2 == wbI64AtomicLoad) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicLoad",L"i64.atomic.load");
      }
      else if (WVar2 == wbI32AtomicLoad8U) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicLoad8U",L"i32.atomic.load8_u");
      }
      else if (WVar2 == wbI32AtomicLoad16U) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicLoad16U",L"i32.atomic.load16_u");
      }
      else if (WVar2 == wbI64AtomicLoad8U) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicLoad8U",L"i64.atomic.load8_u");
      }
      else if (WVar2 == wbI64AtomicLoad16U) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicLoad16U",L"i64.atomic.load16_u");
      }
      else if (WVar2 == wbI64AtomicLoad32U) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicLoad32U",L"i64.atomic.load32_u");
      }
      else if (WVar2 == wbI32AtomicStore) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicStore",L"i32.atomic.store");
      }
      else if (WVar2 == wbI64AtomicStore) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicStore",L"i64.atomic.store");
      }
      else if (WVar2 == wbI32AtomicStore8) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicStore8",L"i32.atomic.store8");
      }
      else if (WVar2 == wbI32AtomicStore16) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicStore16",L"i32.atomic.store16");
      }
      else if (WVar2 == wbI64AtomicStore8) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicStore8",L"i64.atomic.store8");
      }
      else if (WVar2 == wbI64AtomicStore16) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicStore16",L"i64.atomic.store16");
      }
      else if (WVar2 == wbI64AtomicStore32) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicStore32",L"i64.atomic.store32");
      }
      else if (WVar2 == wbI32AtomicRmwAdd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwAdd",L"i32.atomic.rmw.add");
      }
      else if (WVar2 == wbI64AtomicRmwAdd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwAdd",L"i64.atomic.rmw.add");
      }
      else if (WVar2 == wbI32AtomicRmw8UAdd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UAdd",L"i32.atomic.rmw8_u.add");
      }
      else if (WVar2 == wbI32AtomicRmw16UAdd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UAdd",L"i32.atomic.rmw16_u.add");
      }
      else if (WVar2 == wbI64AtomicRmw8UAdd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UAdd",L"i64.atomic.rmw8_u.add");
      }
      else if (WVar2 == wbI64AtomicRmw16UAdd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UAdd",L"i64.atomic.rmw16_u.add");
      }
      else if (WVar2 == wbI64AtomicRmw32UAdd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UAdd",L"i64.atomic.rmw32_u.add");
      }
      else if (WVar2 == wbI32AtomicRmwSub) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwSub",L"i32.atomic.rmw.sub");
      }
      else if (WVar2 == wbI64AtomicRmwSub) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwSub",L"i64.atomic.rmw.sub");
      }
      else if (WVar2 == wbI32AtomicRmw8USub) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8USub",L"i32.atomic.rmw8_u.sub");
      }
      else if (WVar2 == wbI32AtomicRmw16USub) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16USub",L"i32.atomic.rmw16_u.sub");
      }
      else if (WVar2 == wbI64AtomicRmw8USub) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8USub",L"i64.atomic.rmw8_u.sub");
      }
      else if (WVar2 == wbI64AtomicRmw16USub) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16USub",L"i64.atomic.rmw16_u.sub");
      }
      else if (WVar2 == wbI64AtomicRmw32USub) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32USub",L"i64.atomic.rmw32_u.sub");
      }
      else if (WVar2 == wbI32AtomicRmwAnd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwAnd",L"i32.atomic.rmw.and");
      }
      else if (WVar2 == wbI64AtomicRmwAnd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwAnd",L"i64.atomic.rmw.and");
      }
      else if (WVar2 == wbI32AtomicRmw8UAnd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UAnd",L"i32.atomic.rmw8_u.and");
      }
      else if (WVar2 == wbI32AtomicRmw16UAnd) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UAnd",L"i32.atomic.rmw16_u.and");
      }
      else if (WVar2 == wbI64AtomicRmw8UAnd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UAnd",L"i64.atomic.rmw8_u.and");
      }
      else if (WVar2 == wbI64AtomicRmw16UAnd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UAnd",L"i64.atomic.rmw16_u.and");
      }
      else if (WVar2 == wbI64AtomicRmw32UAnd) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UAnd",L"i64.atomic.rmw32_u.and");
      }
      else if (WVar2 == wbI32AtomicRmwOr) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwOr",L"i32.atomic.rmw.or");
      }
      else if (WVar2 == wbI64AtomicRmwOr) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwOr",L"i64.atomic.rmw.or");
      }
      else if (WVar2 == wbI32AtomicRmw8UOr) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UOr",L"i32.atomic.rmw8_u.or");
      }
      else if (WVar2 == wbI32AtomicRmw16UOr) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UOr",L"i32.atomic.rmw16_u.or");
      }
      else if (WVar2 == wbI64AtomicRmw8UOr) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UOr",L"i64.atomic.rmw8_u.or");
      }
      else if (WVar2 == wbI64AtomicRmw16UOr) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UOr",L"i64.atomic.rmw16_u.or");
      }
      else if (WVar2 == wbI64AtomicRmw32UOr) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UOr",L"i64.atomic.rmw32_u.or");
      }
      else if (WVar2 == wbI32AtomicRmwXor) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwXor",L"i32.atomic.rmw.xor");
      }
      else if (WVar2 == wbI64AtomicRmwXor) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwXor",L"i64.atomic.rmw.xor");
      }
      else if (WVar2 == wbI32AtomicRmw8UXor) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UXor",L"i32.atomic.rmw8_u.xor");
      }
      else if (WVar2 == wbI32AtomicRmw16UXor) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UXor",L"i32.atomic.rmw16_u.xor");
      }
      else if (WVar2 == wbI64AtomicRmw8UXor) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UXor",L"i64.atomic.rmw8_u.xor");
      }
      else if (WVar2 == wbI64AtomicRmw16UXor) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UXor",L"i64.atomic.rmw16_u.xor");
      }
      else if (WVar2 == wbI64AtomicRmw32UXor) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UXor",L"i64.atomic.rmw32_u.xor");
      }
      else if (WVar2 == wbI32AtomicRmwXchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwXchg",L"i32.atomic.rmw.xchg");
      }
      else if (WVar2 == wbI64AtomicRmwXchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwXchg",L"i64.atomic.rmw.xchg");
      }
      else if (WVar2 == wbI32AtomicRmw8UXchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UXchg",L"i32.atomic.rmw8_u.xchg");
      }
      else if (WVar2 == wbI32AtomicRmw16UXchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UXchg",L"i32.atomic.rmw16_u.xchg");
      }
      else if (WVar2 == wbI64AtomicRmw8UXchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UXchg",L"i64.atomic.rmw8_u.xchg");
      }
      else if (WVar2 == wbI64AtomicRmw16UXchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UXchg",L"i64.atomic.rmw16_u.xchg");
      }
      else if (WVar2 == wbI64AtomicRmw32UXchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UXchg",L"i64.atomic.rmw32_u.xchg");
      }
      else if (WVar2 == wbI32AtomicRmwCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmwCmpxchg",L"i32.atomic.rmw.cmpxchg");
      }
      else if (WVar2 == wbI64AtomicRmwCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmwCmpxchg",L"i64.atomic.rmw.cmpxchg");
      }
      else if (WVar2 == wbI32AtomicRmw8UCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw8UCmpxchg",L"i32.atomic.rmw8_u.cmpxchg");
      }
      else if (WVar2 == wbI32AtomicRmw16UCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I32AtomicRmw16UCmpxchg",L"i32.atomic.rmw16_u.cmpxchg");
      }
      else if (WVar2 == wbI64AtomicRmw8UCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw8UCmpxchg",L"i64.atomic.rmw8_u.cmpxchg");
      }
      else if (WVar2 == wbI64AtomicRmw16UCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw16UCmpxchg",L"i64.atomic.rmw16_u.cmpxchg");
      }
      else if (WVar2 == wbI64AtomicRmw32UCmpxchg) {
        Output::Print(L"%s: %s\r\n",L"I64AtomicRmw32UCmpxchg",L"i64.atomic.rmw32_u.cmpxchg");
      }
    }
    Memory::DeleteArray<Memory::HeapAllocator,Wasm::WasmOp>
              (&Memory::HeapAllocator::Instance,(long)ops._4_4_,local_20);
  }
  return;
}

Assistant:

void WasmBinaryReader::PrintOps()
{
    int count = m_ops->Count();
    if (count == 0)
    {
        return;
    }
    WasmOp* ops = HeapNewArray(WasmOp, count);

    auto iter = m_ops->GetIterator();
    int i = 0;
    while (iter.IsValid())
    {
        __analysis_assume(i < count);
        ops[i] = iter.CurrentKey();
        iter.MoveNext();
        ++i;
    }
    for (i = 0; i < count; ++i)
    {
        int j = i;
        while (j > 0 && ops[j-1] > ops[j])
        {
            WasmOp tmp = ops[j];
            ops[j] = ops[j - 1];
            ops[j - 1] = tmp;

            --j;
        }
    }

    uint32 moduleId = m_module->GetWasmFunctionInfo(0)->GetBody()->GetSourceContextId();
    Output::Print(_u("Module #%u's current opcode distribution\n"), moduleId);
    for (i = 0; i < count; ++i)
    {
        switch (ops[i])
        {
#define WASM_OPCODE(opname, opcode, sig, imp, wat) \
    case opcode: \
        Output::Print(_u("%s: %s\r\n"), _u(#opname), _u(wat)); \
        break;
#include "WasmBinaryOpCodes.h"
        }
    }
    HeapDeleteArray(count, ops);
}